

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span.h
# Opt level: O3

void __thiscall ChaCha20::Keystream(ChaCha20 *this,Span<std::byte> out)

{
  uint *puVar1;
  long lVar2;
  ulong uVar3;
  ptrdiff_t _Num_1;
  ulong __n;
  ptrdiff_t _Num;
  ulong __n_00;
  byte *__dest;
  long in_FS_OFFSET;
  Span<std::byte> output;
  Span<std::byte> output_00;
  
  __n = out.m_size;
  __dest = out.m_data;
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (__n != 0) {
    uVar3 = (ulong)this->m_bufleft;
    if (uVar3 != 0) {
      puVar1 = &this->m_bufleft;
      __n_00 = __n;
      if (uVar3 < __n) {
        __n_00 = uVar3;
      }
      memmove(__dest,(void *)((long)puVar1 - uVar3),__n_00);
      *puVar1 = *puVar1 - (int)__n_00;
      __dest = __dest + __n_00;
      __n = __n - __n_00;
    }
    if (0x3f < __n) {
      output.m_size = __n & 0xffffffffffffffc0;
      output.m_data = __dest;
      ChaCha20Aligned::Keystream(&this->m_aligned,output);
      __dest = __dest + (__n & 0xffffffffffffffc0);
      __n = (ulong)((uint)__n & 0x3f);
    }
    if (__n != 0) {
      output_00.m_size = 0x40;
      output_00.m_data = (this->m_buffer)._M_elems;
      ChaCha20Aligned::Keystream(&this->m_aligned,output_00);
      memmove(__dest,&this->m_buffer,__n);
      this->m_bufleft = 0x40 - (int)__n;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

constexpr bool empty() const noexcept { return size() == 0; }